

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

string * __thiscall
CppGenerator::getUpperPointer
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,size_t depth,
          bool parallelize)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  unsigned_long uVar10;
  size_type *psVar11;
  char cVar12;
  ulong uVar13;
  string __str;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  ulong *local_80;
  uint local_78;
  undefined4 uStack_74;
  ulong local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (depth == 0 && parallelize) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"upperptr","");
    return __return_storage_ptr__;
  }
  if (depth == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (rel_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + rel_name->_M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  std::operator+(&local_40,"upperptr_",rel_name);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_50 = *puVar9;
    lStack_48 = plVar7[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *puVar9;
    local_60 = (ulong *)*plVar7;
  }
  local_58 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar12 = '\x01';
  if (10 < depth) {
    uVar10 = depth - 1;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar10 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_00275526;
      }
      if (uVar10 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_00275526;
      }
      if (uVar10 < 10000) goto LAB_00275526;
      bVar4 = 99999 < uVar10;
      uVar10 = uVar10 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar4);
    cVar12 = cVar12 + '\x01';
  }
LAB_00275526:
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_80,local_78,depth - 1);
  uVar2 = CONCAT44(uStack_74,local_78) + local_58;
  uVar13 = 0xf;
  if (local_60 != &local_50) {
    uVar13 = local_50;
  }
  if (uVar13 < uVar2) {
    uVar13 = 0xf;
    if (local_80 != local_70) {
      uVar13 = local_70[0];
    }
    if (uVar2 <= uVar13) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_60);
      goto LAB_002755a8;
    }
  }
  puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_80);
LAB_002755a8:
  local_a0 = &local_90;
  puVar1 = puVar8 + 2;
  if ((undefined8 *)*puVar8 == puVar1) {
    local_90 = *puVar1;
    uStack_88 = puVar8[3];
  }
  else {
    local_90 = *puVar1;
    local_a0 = (undefined8 *)*puVar8;
  }
  local_98 = puVar8[1];
  *puVar8 = puVar1;
  puVar8[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_a0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    lVar5 = plVar7[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if (local_a0 != &local_90) {
    operator_delete(local_a0);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::getUpperPointer(const std::string rel_name, size_t depth,
    bool parallelize)
{
    if (depth == 0 && parallelize)
        return "upperptr";
    if (depth == 0)
        return rel_name+".size()-1";
    return "upperptr_"+rel_name+"["+std::to_string(depth-1)+"]";
}